

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_checkpoint_state.cpp
# Opt level: O0

void __thiscall
duckdb::PartialBlockForCheckpoint::Merge
          (PartialBlockForCheckpoint *this,PartialBlock *other_p,idx_t offset,idx_t other_size)

{
  bool bVar1;
  uint uVar2;
  data_ptr_t pdVar3;
  PartialBlockForCheckpoint *this_00;
  reference pPVar4;
  size_t in_RCX;
  long in_RDX;
  long in_RDI;
  PartialColumnSegment *segment;
  iterator __end1_1;
  iterator __begin1_1;
  vector<duckdb::PartialBlockForCheckpoint::PartialColumnSegment,_true> *__range1_1;
  UninitializedRegion *region;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::UninitializedRegion,_true> *__range1;
  BufferHandle new_handle;
  BufferHandle old_handle;
  BufferManager *buffer_manager;
  PartialBlockForCheckpoint *other;
  ColumnData *in_stack_ffffffffffffff18;
  ColumnSegment *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  __normal_iterator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment_*,_std::vector<duckdb::PartialBlockForCheckpoint::PartialColumnSegment,_std::allocator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment>_>_>
  local_a0;
  vector<duckdb::PartialBlockForCheckpoint::PartialColumnSegment,_true> *local_98;
  reference local_90;
  UninitializedRegion *local_88;
  __normal_iterator<duckdb::UninitializedRegion_*,_std::vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>_>
  local_80;
  vector<duckdb::UninitializedRegion,_true> *local_78;
  undefined1 local_60 [24];
  undefined1 local_48 [24];
  long *local_30;
  PartialBlockForCheckpoint *local_28;
  size_t local_20;
  long local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_28 = PartialBlock::Cast<duckdb::PartialBlockForCheckpoint>
                       ((PartialBlock *)in_stack_ffffffffffffff20);
  local_30 = *(long **)(*(long *)(in_RDI + 0x38) + 8);
  (**(code **)(*local_30 + 0x38))(local_48,local_30,&(local_28->super_PartialBlock).block_handle);
  (**(code **)(*local_30 + 0x38))(local_60,local_30,in_RDI + 0x40);
  pdVar3 = BufferHandle::Ptr((BufferHandle *)0xb893a7);
  this_00 = (PartialBlockForCheckpoint *)(pdVar3 + local_18);
  pdVar3 = BufferHandle::Ptr((BufferHandle *)0xb893d0);
  memcpy(this_00,pdVar3,local_20);
  local_78 = &(local_28->super_PartialBlock).uninitialized_regions;
  local_80._M_current =
       (UninitializedRegion *)
       ::std::vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>::
       begin((vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_> *)
             in_stack_ffffffffffffff18);
  local_88 = (UninitializedRegion *)
             ::std::
             vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>::end
                       ((vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
                         *)in_stack_ffffffffffffff18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::UninitializedRegion_*,_std::vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>_>
                        *)in_stack_ffffffffffffff20,
                       (__normal_iterator<duckdb::UninitializedRegion_*,_std::vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>_>
                        *)in_stack_ffffffffffffff18);
    if (!bVar1) break;
    local_90 = __gnu_cxx::
               __normal_iterator<duckdb::UninitializedRegion_*,_std::vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>_>
               ::operator*(&local_80);
    local_90->start = local_90->start + local_18;
    local_90->end = local_90->end + local_18;
    ::std::vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>::
    push_back((vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_> *)
              this_00,(value_type *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    __gnu_cxx::
    __normal_iterator<duckdb::UninitializedRegion_*,_std::vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>_>
    ::operator++(&local_80);
  }
  local_98 = &local_28->segments;
  local_a0._M_current =
       (PartialColumnSegment *)
       ::std::
       vector<duckdb::PartialBlockForCheckpoint::PartialColumnSegment,_std::allocator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment>_>
       ::begin((vector<duckdb::PartialBlockForCheckpoint::PartialColumnSegment,_std::allocator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment>_>
                *)in_stack_ffffffffffffff18);
  ::std::
  vector<duckdb::PartialBlockForCheckpoint::PartialColumnSegment,_std::allocator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment>_>
  ::end((vector<duckdb::PartialBlockForCheckpoint::PartialColumnSegment,_std::allocator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment>_>
         *)in_stack_ffffffffffffff18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment_*,_std::vector<duckdb::PartialBlockForCheckpoint::PartialColumnSegment,_std::allocator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment>_>_>
                        *)in_stack_ffffffffffffff20,
                       (__normal_iterator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment_*,_std::vector<duckdb::PartialBlockForCheckpoint::PartialColumnSegment,_std::allocator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment>_>_>
                        *)in_stack_ffffffffffffff18);
    if (!bVar1) break;
    pPVar4 = __gnu_cxx::
             __normal_iterator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment_*,_std::vector<duckdb::PartialBlockForCheckpoint::PartialColumnSegment,_std::allocator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment>_>_>
             ::operator*(&local_a0);
    in_stack_ffffffffffffff18 = pPVar4->data;
    in_stack_ffffffffffffff20 = pPVar4->segment;
    uVar2 = NumericCast<unsigned_int,unsigned_long,void>(0xb8954b);
    AddSegmentToTail(this_00,(ColumnData *)CONCAT44(uVar2,in_stack_ffffffffffffff28),
                     in_stack_ffffffffffffff20,(uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20))
    ;
    __gnu_cxx::
    __normal_iterator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment_*,_std::vector<duckdb::PartialBlockForCheckpoint::PartialColumnSegment,_std::allocator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment>_>_>
    ::operator++(&local_a0);
  }
  (*(local_28->super_PartialBlock)._vptr_PartialBlock[4])();
  BufferHandle::~BufferHandle((BufferHandle *)in_stack_ffffffffffffff20);
  BufferHandle::~BufferHandle((BufferHandle *)in_stack_ffffffffffffff20);
  return;
}

Assistant:

void PartialBlockForCheckpoint::Merge(PartialBlock &other_p, idx_t offset, idx_t other_size) {
	auto &other = other_p.Cast<PartialBlockForCheckpoint>();

	auto &buffer_manager = block_manager.buffer_manager;
	// pin the source block
	auto old_handle = buffer_manager.Pin(other.block_handle);
	// pin the target block
	auto new_handle = buffer_manager.Pin(block_handle);
	// memcpy the contents of the old block to the new block
	memcpy(new_handle.Ptr() + offset, old_handle.Ptr(), other_size);

	// now copy over all segments to the new block
	// move over the uninitialized regions
	for (auto &region : other.uninitialized_regions) {
		region.start += offset;
		region.end += offset;
		uninitialized_regions.push_back(region);
	}

	// move over the segments
	for (auto &segment : other.segments) {
		AddSegmentToTail(segment.data, segment.segment, NumericCast<uint32_t>(segment.offset_in_block + offset));
	}

	other.Clear();
}